

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Latch.hpp
# Opt level: O0

void __thiscall gmlc::concurrency::Latch::arrive(Latch *this)

{
  __int_type_conflict1 _Var1;
  undefined1 local_20 [8];
  unique_lock<std::mutex> lck;
  Latch *this_local;
  
  lck._8_8_ = this;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_20,&this->mtx);
  std::__atomic_base<int>::operator--(&(this->counter_).super___atomic_base<int>);
  _Var1 = std::__atomic_base::operator_cast_to_int((__atomic_base *)&this->counter_);
  if (_Var1 == 0) {
    std::condition_variable::notify_all();
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_20);
  return;
}

Assistant:

void arrive()
        {
            std::unique_lock<std::mutex> lck(mtx);
            --counter_;
            if (counter_ == 0) {
                cv.notify_all();
            }
        }